

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void print_bb_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,int with_notes_p)

{
  byte bVar1;
  MIR_reg_t MVar2;
  MIR_context_t ctx;
  long *plVar3;
  bitmap_t pVVar4;
  func_cfg_t pfVar5;
  bb_t pbVar6;
  bb_t_conflict pbVar7;
  MIR_op_t op_00;
  uint uVar8;
  MIR_insn_t pMVar9;
  ulong uVar10;
  char *pcVar11;
  int extraout_EDX;
  ulong uVar12;
  ulong uVar13;
  bb_t extraout_RDX;
  FILE *__stream;
  bb_t_conflict pbVar14;
  char *pcVar15;
  gen_ctx *ctx_00;
  ulong uVar16;
  uint *puVar17;
  long *plVar18;
  dead_var_t pdVar19;
  long lVar20;
  MIR_op_t op;
  undefined8 local_68;
  undefined7 uStack_5f;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  ctx = gen_ctx->ctx;
  print_insn(gen_ctx,bb_insn->insn,0);
  pcVar15 = " # indexes: ";
  __stream = (FILE *)0xc;
  fwrite(" # indexes: ",0xc,1,(FILE *)gen_ctx->debug_file);
  pMVar9 = bb_insn->insn;
  if (*(int *)&pMVar9->field_0x1c != 0) {
    uVar12 = 0;
    do {
      if (uVar12 != 0) {
        fputc(0x2c,(FILE *)gen_ctx->debug_file);
        pMVar9 = bb_insn->insn;
      }
      plVar3 = (long *)pMVar9->ops[uVar12].data;
      if (plVar3 == (long *)0x0) {
        __stream = (FILE *)gen_ctx->debug_file;
        pcVar15 = (char *)0x5f;
        fputc(0x5f,__stream);
      }
      else {
        plVar18 = plVar3;
        if ((bb_insn_t_conflict)plVar3[1] == bb_insn) {
          do {
            pcVar15 = ", ";
            if (plVar18 == plVar3) {
              pcVar15 = "(";
            }
            fprintf((FILE *)gen_ctx->debug_file,"%s%d",pcVar15,(ulong)*(uint *)(*plVar18 + 0xc));
            plVar18 = (long *)plVar18[4];
          } while (plVar18 != (long *)0x0);
          __stream = (FILE *)gen_ctx->debug_file;
          pcVar15 = (char *)0x29;
          fputc(0x29,__stream);
        }
        else {
          pcVar15 = (char *)gen_ctx->debug_file;
          __stream = (FILE *)0x1bd228;
          fprintf((FILE *)pcVar15,"%d",(ulong)((bb_insn_t_conflict)plVar3[1])->index);
        }
      }
      pMVar9 = bb_insn->insn;
      uVar12 = uVar12 + 1;
    } while (uVar12 < *(uint *)&pMVar9->field_0x1c);
  }
  if (with_notes_p != 0) {
    pdVar19 = (bb_insn->insn_dead_vars).head;
    if (pdVar19 != (dead_var_t_conflict)0x0) {
      do {
        pcVar15 = " # dead: ";
        MVar2 = pdVar19->var;
        if (pdVar19 != (bb_insn->insn_dead_vars).head) {
          pcVar15 = " ";
        }
        fprintf((FILE *)gen_ctx->debug_file,pcVar15);
        op_00._9_7_ = uStack_5f;
        op_00._8_1_ = 2;
        op_00.u.mem.alias = uStack_54;
        op_00.u.reg = MVar2;
        __stream = (FILE *)gen_ctx->debug_file;
        op_00.data = (void *)local_68;
        op_00.u.str.s = (char *)uStack_50;
        op_00.u._16_8_ = uStack_48;
        op_00.u.mem.disp = uStack_40;
        pcVar15 = (char *)ctx;
        MIR_output_op(ctx,(FILE *)__stream,op_00,(gen_ctx->curr_func_item->u).func);
        pdVar19 = (pdVar19->dead_var_link).next;
      } while (pdVar19 != (dead_var_t)0x0);
      pMVar9 = bb_insn->insn;
    }
    if (0xfffffffc < *(int *)&pMVar9->field_0x18 - 0xaaU) {
      pVVar4 = bb_insn->call_hard_reg_args;
      if (pVVar4 == (bitmap_t)0x0) {
        print_bb_insn_cold_1();
        ctx_00 = ((MIR_context_t)pcVar15)->gen_ctx;
        MIR_output_insn((MIR_context_t)ctx_00,
                        *(FILE **)&((MIR_context_t)pcVar15)->func_redef_permission_p,
                        (MIR_insn_t_conflict)__stream,
                        *(MIR_func_t *)(((MIR_context_t)pcVar15)->error_func + 0x40),0);
        pcVar11 = __stream->_IO_read_base;
        if ((ulong)pcVar11 >> 0x20 != 0) {
          puVar17 = (uint *)((long)&__stream->_IO_buf_base + 4);
          uVar12 = 0;
          do {
            if (*puVar17 != 0 && (char)puVar17[-5] == '\v') {
              pbVar14 = (bb_t_conflict)(((MIR_context_t)((long)pcVar15 + 0x118))->all_modules).tail;
              if (((pbVar14 == (bb_t_conflict)0x0) || (pbVar14->rpost == 0)) ||
                 (uVar13 = (ulong)*puVar17, pbVar14->index <= uVar13)) {
                print_insn_cold_1();
                if ((pbVar14 == (bb_t_conflict)0x0) ||
                   (pfVar5 = ctx_00->curr_cfg, (pfVar5->bbs).head == (bb_t_conflict)0x0)) {
                  insert_new_bb_after_cold_3();
LAB_001601e0:
                  insert_new_bb_after_cold_1();
                }
                else {
                  pbVar6 = (pbVar14->bb_link).next;
                  pbVar7 = (pfVar5->bbs).tail;
                  if (pbVar6 != (bb_t)0x0) {
                    if (pbVar7 != (bb_t_conflict)0x0) {
                      (pbVar6->bb_link).prev = extraout_RDX;
                      (extraout_RDX->bb_link).next = pbVar6;
                      (pbVar14->bb_link).next = extraout_RDX;
                      (extraout_RDX->bb_link).prev = pbVar14;
                      goto LAB_001601c7;
                    }
                    goto LAB_001601e0;
                  }
                  if (pbVar7 == pbVar14) {
                    (pbVar14->bb_link).next = extraout_RDX;
                    (extraout_RDX->bb_link).prev = pbVar14;
                    (extraout_RDX->bb_link).next = (bb_t)0x0;
                    (pfVar5->bbs).tail = extraout_RDX;
LAB_001601c7:
                    uVar8 = ctx_00->curr_bb_index;
                    ctx_00->curr_bb_index = uVar8 + 1;
                    extraout_RDX->index = (ulong)uVar8;
                    return;
                  }
                }
                insert_new_bb_after_cold_2();
                if (ctx_00->to_free == (VARR_void_ptr_t *)0x0) goto LAB_00160253;
                if (*(long *)&ctx_00->addr_insn_p != 0) {
                  uVar8 = ctx_00->optimize_level;
                  if (uVar8 != 0) {
                    uVar12 = 0;
                    lVar20 = *(long *)(*(long *)&ctx_00->addr_insn_p + 0x10) + 8;
                    do {
                      if (*(int *)(lVar20 + -8) != 0) {
                        (*(code *)ctx_00->to_free)();
                        uVar8 = ctx_00->optimize_level;
                      }
                      uVar12 = uVar12 + 1;
                      lVar20 = lVar20 + 0x20;
                    } while (uVar12 < uVar8);
                  }
LAB_00160253:
                  ctx_00->optimize_level = 0;
                  ctx_00->ctx = (MIR_context_t)0x0;
                  pVVar4 = ctx_00->tied_regs;
                  if (pVVar4 != (bitmap_t)0x0) {
                    if ((int)pVVar4->els_num != 0) {
                      memset(pVVar4->varr,0xff,(pVVar4->els_num & 0xffffffff) << 2);
                      return;
                    }
                    return;
                  }
                  HTAB_def_tab_el_t_clear_cold_2();
                }
                HTAB_def_tab_el_t_clear_cold_1();
                return;
              }
              bVar1 = *(byte *)(pbVar14->rpost + uVar13 * 0x20);
              pcVar11 = "u";
              if ((bVar1 & 3) != 0) {
                pcVar11 = "au";
              }
              ctx_00 = *(gen_ctx **)&((MIR_context_t)pcVar15)->func_redef_permission_p;
              if (bVar1 == 0) {
                pcVar11 = "";
              }
              fprintf((FILE *)ctx_00," # m%lu%s",uVar13,pcVar11);
              pcVar11 = __stream->_IO_read_base;
            }
            uVar12 = uVar12 + 1;
            puVar17 = puVar17 + 0xc;
          } while (uVar12 < (ulong)pcVar11 >> 0x20);
        }
        if (extraout_EDX != 0) {
          fputc(10,*(FILE **)&((MIR_context_t)pcVar15)->func_redef_permission_p);
          return;
        }
        return;
      }
      uVar12 = pVVar4->els_num;
      if (uVar12 != 0) {
        uVar10 = 0;
        uVar13 = 0;
        pcVar15 = " # call used: hr%ld";
        do {
          while ((pVVar4->varr[uVar10] == 0 ||
                 (uVar16 = pVVar4->varr[uVar10] >> (uVar13 & 0x3f), uVar16 == 0))) {
            uVar10 = uVar10 + 1;
            uVar13 = uVar10 * 0x40;
            if (uVar12 == uVar10) goto LAB_0016003b;
          }
          uVar12 = uVar16 & 1;
          while (uVar12 == 0) {
            uVar13 = uVar13 + 1;
            uVar12 = uVar16 & 2;
            uVar16 = uVar16 >> 1;
          }
          uVar13 = uVar13 + 1;
          fprintf((FILE *)gen_ctx->debug_file,pcVar15);
          uVar12 = pVVar4->els_num;
          uVar10 = uVar13 >> 6;
          pcVar15 = " hr%ld";
        } while (uVar10 < uVar12);
      }
    }
  }
LAB_0016003b:
  fputc(10,(FILE *)gen_ctx->debug_file);
  return;
}

Assistant:

static void print_bb_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn, int with_notes_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_op_t op;
  int first_p;
  size_t nel;
  bitmap_iterator_t bi;

  print_insn (gen_ctx, bb_insn->insn, FALSE);
  fprintf (debug_file, " # indexes: ");
  for (size_t i = 0; i < bb_insn->insn->nops; i++) {
    if (i != 0) fprintf (debug_file, ",");
    print_op_data (gen_ctx, bb_insn->insn->ops[i].data, bb_insn);
  }
  if (with_notes_p) {
    for (dead_var_t dv = DLIST_HEAD (dead_var_t, bb_insn->insn_dead_vars); dv != NULL;
         dv = DLIST_NEXT (dead_var_t, dv)) {
      op.mode = MIR_OP_VAR;
      op.u.var = dv->var;
      fprintf (debug_file,
               dv == DLIST_HEAD (dead_var_t, bb_insn->insn_dead_vars) ? " # dead: " : " ");
      MIR_output_op (ctx, debug_file, op, curr_func_item->u.func);
    }
    if (MIR_call_code_p (bb_insn->insn->code)) {
      first_p = TRUE;
      FOREACH_BITMAP_BIT (bi, bb_insn->call_hard_reg_args, nel) {
        fprintf (debug_file, first_p ? " # call used: hr%ld" : " hr%ld", (unsigned long) nel);
        first_p = FALSE;
      }
    }
  }
  fprintf (debug_file, "\n");
}